

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O3

QStringList * QCoreApplication::arguments(void)

{
  _Head_base<0UL,_QCoreApplicationPrivate_*,_false> _Var1;
  char **ppcVar2;
  char *pcVar3;
  DataPointer *pDVar4;
  QString *pQVar5;
  int *piVar6;
  QString *this;
  QList<QString> *in_RDI;
  long lVar7;
  long asize;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (QString *)0x0;
  (in_RDI->d).size = 0;
  if (self != (QCoreApplication *)0x0) {
    _Var1._M_head_impl =
         (self->d_ptr)._M_t.
         super___uniq_ptr_impl<QCoreApplicationPrivate,_std::default_delete<QCoreApplicationPrivate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QCoreApplicationPrivate_*,_std::default_delete<QCoreApplicationPrivate>_>
         .super__Head_base<0UL,_QCoreApplicationPrivate_*,_false>._M_head_impl;
    piVar6 = (_Var1._M_head_impl)->argc;
    ppcVar2 = (_Var1._M_head_impl)->argv;
    asize = (long)*piVar6;
    QList<QString>::reserve(in_RDI,asize);
    if (0 < asize) {
      lVar7 = 0;
      do {
        pcVar3 = ppcVar2[lVar7];
        if (pcVar3 == (char *)0x0) {
          this = (QString *)0x0;
        }
        else {
          pQVar5 = (QString *)0xffffffffffffffff;
          do {
            this = (QString *)((long)&(pQVar5->d).d + 1);
            pDVar4 = &pQVar5->d;
            pQVar5 = this;
          } while (*(char *)((long)&pDVar4->d + (long)(pcVar3 + 1)) != '\0');
        }
        ba.m_data = (storage_type *)piVar6;
        ba.m_size = (qsizetype)pcVar3;
        QString::fromLocal8Bit(&local_48,this,ba);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)in_RDI,(in_RDI->d).size,&local_48);
        QList<QString>::end(in_RDI);
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != asize);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStringList QCoreApplication::arguments()
{
    QStringList list;

    if (!self) {
        qWarning("QCoreApplication::arguments: Please instantiate the QApplication object first");
        return list;
    }

    const QCoreApplicationPrivate *d = self->d_func();

    const int argc = d->argc;
    char ** const argv = d->argv;
    list.reserve(argc);

#if defined(Q_OS_WIN)
    const bool argsModifiedByUser = d->origArgv == nullptr;
    if (!argsModifiedByUser) {
        QStringList commandLineArguments = winCmdArgs();

        // Even if the user didn't modify argv before passing them
        // on to QCoreApplication, derived QApplications might have.
        // If that's the case argc will differ from origArgc.
        if (argc != d->origArgc) {
            // Note: On MingGW the arguments from GetCommandLine are
            // not wildcard expanded (if wildcard expansion is enabled),
            // as opposed to the arguments in argv. This means we can't
            // compare commandLineArguments to argv/origArgc, but
            // must remove elements by value, based on whether they
            // were filtered out from argc.
            for (int i = 0; i < d->origArgc; ++i) {
                if (!contains(argc, argv, d->origArgv[i]))
                    commandLineArguments.removeAll(QString::fromLocal8Bit(d->origArgv[i]));
            }
        }

        return commandLineArguments;
    } // Fall back to rebuilding from argv/argc when a modified argv was passed.
#endif // defined(Q_OS_WIN)

    for (int a = 0; a < argc; ++a)
        list << QString::fromLocal8Bit(argv[a]);

    return list;
}